

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum32.c
# Opt level: O2

_Bool Hacl_Bignum32_mod_exp_consttime
                (uint32_t len,uint32_t *n,uint32_t *a,uint32_t bBits,uint32_t *b,uint32_t *res)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = Hacl_Bignum_Exponentiation_bn_check_mod_exp_u32(len,n,a,bBits,b);
  uVar2 = Hacl_Bignum_Lib_bn_get_top_index_u32(len,n);
  if (uVar1 == 0xffffffff) {
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_u32(len,uVar2 << 5,n,a,bBits,b,res);
  }
  else {
    memset(res,0,(ulong)len << 2);
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool
Hacl_Bignum32_mod_exp_consttime(
  uint32_t len,
  uint32_t *n,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  uint32_t is_valid_m = Hacl_Bignum_Exponentiation_bn_check_mod_exp_u32(len, n, a, bBits, b);
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(len, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_u32(len, nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, len * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}